

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

directory_iterator * __thiscall
ghc::filesystem::directory_iterator::operator++(directory_iterator *this)

{
  bool bVar1;
  int code;
  element_type *peVar2;
  filesystem_error *this_00;
  error_code ec_00;
  string local_40;
  undefined1 auStack_20 [8];
  error_code ec;
  directory_iterator *this_local;
  
  ec._M_cat = (error_category *)this;
  std::error_code::error_code((error_code *)auStack_20);
  peVar2 = std::
           __shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  impl::increment(peVar2,(error_code *)auStack_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return this;
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_20);
  detail::systemErrorText<int>(&local_40,code);
  peVar2 = std::
           __shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  ec_00._0_8_ = (ulong)auStack_20 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this_00,&local_40,&peVar2->_current,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE directory_iterator& directory_iterator::operator++()
{
    std::error_code ec;
    _impl->increment(ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), _impl->_current, ec);
    }
    return *this;
}